

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::OnMessage(CGameClient *this,int MsgId,CUnpacker *pUnpacker)

{
  CComponent *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  IClient *pIVar5;
  char *pcVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  IConsole *pIVar10;
  CConfig *pCVar11;
  IFriends *pIVar12;
  IBlacklist *pIVar13;
  CNetObjHandler *in_RDX;
  uint in_ESI;
  CGameClient *in_RDI;
  long in_FS_OFFSET;
  float fVar14;
  CNetMsg_De_ClientLeave *pMsg_10;
  CNetMsg_De_ClientEnter *pMsg_9;
  CNetMsg_Sv_Emoticon *pMsg_8;
  CNetMsg_Sv_Team *pMsg_7;
  CNetMsg_Sv_ServerSettings *pMsg_6;
  CNetMsg_Sv_GameInfo *pMsg_5;
  int i_5;
  CNetMsg_Sv_SkinChange *pMsg_4;
  CNetMsg_Sv_ClientDrop *pMsg_3;
  int i_4;
  CNetMsg_Sv_ClientInfo *pMsg_2;
  int i_3;
  void *pRawMsg;
  char *pText;
  float Time;
  int ClientID;
  int ClientID_1;
  char *pMsg_1;
  char *pMsg;
  bool TeamPlay;
  int i_2;
  int NumParaI;
  int GameMsgID;
  char *pDescription;
  int i_1;
  int NumOptions;
  uint i;
  int *pParams;
  CNetMsg_De_ClientLeave Msg_1;
  CNetMsg_De_ClientEnter Msg;
  CTuningParams NewTuning;
  char aLabel_2 [64];
  char aBuf_2 [128];
  char aBuf_1 [256];
  char aLabel [64];
  char aLabel_1 [64];
  char aBuf [256];
  int aParaI [3];
  int in_stack_fffffffffffffa98;
  int in_stack_fffffffffffffa9c;
  CGameClient *in_stack_fffffffffffffaa0;
  CClientData *in_stack_fffffffffffffaa8;
  CGameClient *in_stack_fffffffffffffab0;
  IClient *in_stack_fffffffffffffab8;
  CGameClient *in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  char *in_stack_fffffffffffffad0;
  CGameClient *in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffb1c;
  char *in_stack_fffffffffffffb28;
  CChat *in_stack_fffffffffffffb30;
  int local_48c;
  int local_47c;
  int local_444;
  int local_440;
  int local_42c;
  int in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  uint uVar15;
  undefined8 in_stack_fffffffffffffbe0;
  undefined1 *puVar16;
  undefined1 local_3d8 [128];
  undefined1 local_358 [64];
  char local_318 [128];
  char local_298 [256];
  undefined1 local_198 [64];
  undefined1 local_158 [64];
  char local_118 [260];
  int local_14 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar5 = Client(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[9])();
  if (in_ESI == 6) {
    pIVar5 = Client(in_RDI);
    iVar3 = IClient::State(pIVar5);
    if (iVar3 != 4) {
      pIVar5 = Client(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
      CTuningParams::CTuningParams((CTuningParams *)in_stack_fffffffffffffaa0);
      puVar16 = local_3d8;
      for (uVar15 = 0; uVar15 < 0x20; uVar15 = uVar15 + 1) {
        iVar3 = CUnpacker::GetInt((CUnpacker *)in_stack_fffffffffffffaa0);
        *(int *)(puVar16 + (ulong)uVar15 * 4) = iVar3;
      }
      bVar2 = CUnpacker::Error((CUnpacker *)in_RDX);
      if (!bVar2) {
        in_RDI->m_ServerMode = 0;
        memcpy(&in_RDI->m_Tuning,local_3d8,0x80);
      }
      goto switchD_001cc6da_default;
    }
  }
  iVar3 = (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  if (in_ESI == 0xc) {
    in_stack_fffffffffffffbd8 = CUnpacker::GetInt((CUnpacker *)in_stack_fffffffffffffaa0);
    for (local_42c = 0; iVar3 = (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
        local_42c < in_stack_fffffffffffffbd8; local_42c = local_42c + 1) {
      CUnpacker::GetString
                ((CUnpacker *)in_stack_fffffffffffffab8,
                 (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
      bVar2 = CUnpacker::Error((CUnpacker *)in_RDX);
      if (bVar2) goto switchD_001cc6da_default;
      CVoting::AddOption((CVoting *)in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8);
    }
  }
  else if (in_ESI == 0x15) {
    iVar4 = CUnpacker::GetInt((CUnpacker *)in_stack_fffffffffffffaa0);
    if ((iVar4 < 0) || (10 < iVar4)) goto switchD_001cc6da_default;
    local_440 = 0;
    in_stack_fffffffffffffb1c = gs_GameMsgList[iVar4].m_ParaType;
    if (in_stack_fffffffffffffb1c == 1) {
      local_440 = 1;
    }
    else if (in_stack_fffffffffffffb1c == 2) {
      local_440 = 2;
    }
    else if (in_stack_fffffffffffffb1c == 3) {
      local_440 = 3;
    }
    for (local_444 = 0; iVar3 = (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
        local_444 < local_440; local_444 = local_444 + 1) {
      iVar3 = CUnpacker::GetInt((CUnpacker *)in_stack_fffffffffffffaa0);
      local_14[local_444] = iVar3;
    }
    bVar2 = CUnpacker::Error((CUnpacker *)in_RDX);
    if (bVar2) goto switchD_001cc6da_default;
    bVar2 = ((in_RDI->m_GameInfo).m_GameFlags & 1U) != 0;
    if (gs_GameMsgList[iVar4].m_Action == 2) {
      switch(iVar4) {
      case 4:
        CSounds::Enqueue((CSounds *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                         in_stack_fffffffffffffa98);
        break;
      case 5:
        CSounds::Enqueue((CSounds *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                         in_stack_fffffffffffffa98);
        break;
      case 6:
        iVar3 = GetStrTeam(local_14[0],bVar2);
        switch(iVar3) {
        case 0:
          Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
          break;
        case 1:
          Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
          break;
        case 2:
          Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
          break;
        case 3:
          Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
        }
        CBroadcast::DoClientBroadcast
                  ((CBroadcast *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
        break;
      case 7:
        iVar3 = GetStrTeam(local_14[0],bVar2);
        if (iVar3 == 1) {
          Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
        }
        else if (iVar3 == 2) {
          Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
        }
        CBroadcast::DoClientBroadcast
                  ((CBroadcast *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
        break;
      case 8:
        if ((in_RDI->m_LocalClientID == -1) ||
           ((in_RDI->m_aClients[in_RDI->m_LocalClientID].m_Team == local_14[0] &&
            ((((in_RDI->m_Snap).m_SpecInfo.m_Active & 1U) == 0 ||
             (((((in_RDI->m_Snap).m_SpecInfo.m_SpectatorID == -1 ||
                (in_RDI->m_aClients[(in_RDI->m_Snap).m_SpecInfo.m_SpectatorID].m_Team == local_14[0]
                )) && (((in_RDI->m_Snap).m_SpecInfo.m_SpecMode != 2 || (local_14[0] == 0)))) &&
              (((in_RDI->m_Snap).m_SpecInfo.m_SpecMode != 3 || (local_14[0] == 1)))))))))) {
          CSounds::Enqueue((CSounds *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                           in_stack_fffffffffffffa98);
        }
        else {
          CSounds::Enqueue((CSounds *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                           in_stack_fffffffffffffa98);
        }
        break;
      case 9:
        CSounds::Enqueue((CSounds *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                         in_stack_fffffffffffffa98);
        iVar3 = clamp<int>(local_14[1],0,0x3f);
        CStats::OnFlagCapture(in_RDI->m_pStats,iVar3);
        GetPlayerLabel(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName,
                       (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),
                       (int)in_stack_fffffffffffffaa0,
                       (char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        pIVar5 = Client(in_RDI);
        iVar3 = IClient::GameTickSpeed(pIVar5);
        fVar14 = (float)local_14[2] / (float)iVar3;
        if (60.0 < fVar14) {
          if (local_14[0] == 0) {
            pcVar6 = local_118;
            pcVar8 = Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
            str_format(pcVar6,0x100,pcVar8,local_198);
          }
          else {
            pcVar6 = local_118;
            pcVar8 = Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
            str_format(pcVar6,0x100,pcVar8,local_198);
          }
        }
        else if (local_14[0] == 0) {
          pcVar6 = Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
          str_format((char *)(double)fVar14,(int)local_118,(char *)0x100,pcVar6,local_198);
        }
        else {
          pcVar6 = Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
          str_format((char *)(double)fVar14,(int)local_118,(char *)0x100,pcVar6,local_198);
        }
        CChat::AddLine(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffb1c);
        break;
      case 10:
        clamp<int>(local_14[0],0,0x3f);
        GetPlayerLabel(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName,
                       (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),
                       (int)in_stack_fffffffffffffaa0,
                       (char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        pcVar6 = Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
        str_format(local_118,0x100,pcVar6,local_158);
        CChat::AddLine(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffb1c);
      }
      goto switchD_001cc6da_default;
    }
    if (local_440 == 0) {
      Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
    }
    in_stack_fffffffffffffacc = gs_GameMsgList[iVar4].m_Action;
    if (in_stack_fffffffffffffacc == 0) {
      CChat::AddLine(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffb1c);
    }
    else if (in_stack_fffffffffffffacc == 1) {
      CBroadcast::DoClientBroadcast
                ((CBroadcast *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
    }
  }
  piVar7 = (int *)CNetObjHandler::SecureUnpackMsg
                            (in_RDX,iVar3,
                             (CUnpacker *)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if (piVar7 == (int *)0x0) {
    pcVar6 = local_298;
    pcVar8 = CNetObjHandler::GetMsgName(&in_RDI->m_NetObjHandler,in_ESI);
    pcVar9 = CNetObjHandler::FailedMsgOn(&in_RDI->m_NetObjHandler);
    str_format(pcVar6,0x100,"dropped weird message \'%s\' (%d), failed on \'%s\'",pcVar8,
               (ulong)in_ESI,pcVar9);
    pIVar10 = Console(in_RDI);
    (*(pIVar10->super_IInterface)._vptr_IInterface[0x19])(pIVar10,1,"client",local_298,0);
    goto switchD_001cc6da_default;
  }
  for (local_47c = 0; local_47c < (in_RDI->m_All).m_Num; local_47c = local_47c + 1) {
    pCVar1 = (in_RDI->m_All).m_paComponents[local_47c];
    (*pCVar1->_vptr_CComponent[0xb])(pCVar1,(ulong)in_ESI,piVar7);
  }
  if (in_ESI == 0x12) {
    pIVar5 = Client(in_RDI);
    iVar3 = IClient::State(pIVar5);
    if (iVar3 != 4) {
      pIVar5 = Client(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
      if (piVar7[1] == 0) {
        if ((in_RDI->m_aClients[*piVar7].m_Active & 1U) != 0) {
          pCVar11 = Config(in_RDI);
          if (pCVar11->m_Debug != 0) {
            pIVar10 = Console(in_RDI);
            (*(pIVar10->super_IInterface)._vptr_IInterface[0x19])
                      (pIVar10,1,"client","invalid clientinfo",0);
          }
          goto switchD_001cc6da_default;
        }
        if ((in_RDI->m_LocalClientID != -1) && (piVar7[0x22] == 0)) {
          DoEnterMessage(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                         in_stack_fffffffffffffacc,in_stack_fffffffffffffac8);
          uVar15 = (*(in_RDI->m_pDemoRecorder->super_IInterface)._vptr_IInterface[2])();
          if ((uVar15 & 1) != 0) {
            Client(in_RDI);
            IClient::SendPackMsg<CNetMsg_De_ClientEnter>
                      (in_stack_fffffffffffffab8,(CNetMsg_De_ClientEnter *)in_stack_fffffffffffffab0
                       ,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          }
        }
      }
      else {
        if (in_RDI->m_LocalClientID != -1) {
          pCVar11 = Config(in_RDI);
          if (pCVar11->m_Debug != 0) {
            pIVar10 = Console(in_RDI);
            (*(pIVar10->super_IInterface)._vptr_IInterface[0x19])
                      (pIVar10,1,"client","invalid local clientinfo",0);
          }
          goto switchD_001cc6da_default;
        }
        in_RDI->m_LocalClientID = *piVar7;
        pIVar5 = Client(in_RDI);
        fVar14 = IClient::LocalTime(pIVar5);
        in_RDI->m_TeamChangeTime = fVar14;
      }
      in_RDI->m_aClients[*piVar7].m_Active = true;
      in_RDI->m_aClients[*piVar7].m_Team = piVar7[2];
      str_utf8_copy_num(in_stack_fffffffffffffad0,
                        (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                        (int)((ulong)in_stack_fffffffffffffac0 >> 0x20),
                        (int)in_stack_fffffffffffffac0);
      str_utf8_copy_num(in_stack_fffffffffffffad0,
                        (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                        (int)((ulong)in_stack_fffffffffffffac0 >> 0x20),
                        (int)in_stack_fffffffffffffac0);
      in_RDI->m_aClients[*piVar7].m_Country = piVar7[8];
      for (local_48c = 0; local_48c < 6; local_48c = local_48c + 1) {
        str_utf8_copy_num(in_stack_fffffffffffffad0,
                          (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                          (int)((ulong)in_stack_fffffffffffffac0 >> 0x20),
                          (int)in_stack_fffffffffffffac0);
        in_RDI->m_aClients[*piVar7].m_aUseCustomColors[local_48c] = piVar7[(long)local_48c + 0x16];
        in_RDI->m_aClients[*piVar7].m_aSkinPartColors[local_48c] = piVar7[(long)local_48c + 0x1c];
      }
      pIVar12 = Friends(in_RDI);
      iVar3 = (*(pIVar12->super_IInterface)._vptr_IInterface[6])
                        (pIVar12,in_RDI->m_aClients + *piVar7,in_RDI->m_aClients[*piVar7].m_aClan,1)
      ;
      in_RDI->m_aClients[*piVar7].m_Friend = (bool)((byte)iVar3 & 1);
      pIVar13 = Blacklist(in_RDI);
      iVar3 = (*(pIVar13->super_IInterface)._vptr_IInterface[3])
                        (pIVar13,in_RDI->m_aClients + *piVar7,in_RDI->m_aClients[*piVar7].m_aClan,1)
      ;
      in_RDI->m_aClients[*piVar7].m_ChatIgnore = (bool)((byte)iVar3 & 1);
      if ((in_RDI->m_aClients[*piVar7].m_ChatIgnore & 1U) != 0) {
        GetPlayerLabel(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName,
                       (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),
                       (int)in_stack_fffffffffffffaa0,
                       (char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        pcVar6 = local_318;
        pcVar8 = Localize(pcVar6,in_stack_fffffffffffffaa8->m_aName);
        str_format(pcVar6,0x80,pcVar8,local_358);
        CChat::AddLine(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffb1c);
      }
      CClientData::UpdateRenderInfo
                ((CClientData *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                 in_stack_fffffffffffffac0,(int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffab8 >> 0x18,0));
      (in_RDI->m_GameInfo).m_NumPlayers = (in_RDI->m_GameInfo).m_NumPlayers + 1;
      if (in_RDI->m_aClients[*piVar7].m_Team != -1) {
        iVar3 = in_RDI->m_aClients[*piVar7].m_Team;
        (in_RDI->m_GameInfo).m_aTeamSize[iVar3] = (in_RDI->m_GameInfo).m_aTeamSize[iVar3] + 1;
      }
      CStats::OnPlayerEnter
                ((CStats *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                 in_stack_fffffffffffffa98);
      goto switchD_001cc6da_default;
    }
  }
  if (in_ESI == 0x14) {
    pIVar5 = Client(in_RDI);
    iVar3 = IClient::State(pIVar5);
    if (iVar3 != 4) {
      pIVar5 = Client(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
      if ((in_RDI->m_LocalClientID == *piVar7) || ((in_RDI->m_aClients[*piVar7].m_Active & 1U) == 0)
         ) {
        pCVar11 = Config(in_RDI);
        if (pCVar11->m_Debug != 0) {
          pIVar10 = Console(in_RDI);
          (*(pIVar10->super_IInterface)._vptr_IInterface[0x19])
                    (pIVar10,1,"client","invalid clientdrop",0);
        }
      }
      else {
        if (piVar7[4] == 0) {
          DoLeaveMessage((CGameClient *)
                         CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                         (char *)in_stack_fffffffffffffac0,
                         (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                         (char *)in_stack_fffffffffffffab0);
          Client(in_RDI);
          IClient::SendPackMsg<CNetMsg_De_ClientLeave>
                    (in_stack_fffffffffffffab8,(CNetMsg_De_ClientLeave *)in_stack_fffffffffffffab0,
                     (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
        }
        (in_RDI->m_GameInfo).m_NumPlayers = (in_RDI->m_GameInfo).m_NumPlayers + -1;
        if (in_RDI->m_aClients[*piVar7].m_Team != -1) {
          iVar3 = in_RDI->m_aClients[*piVar7].m_Team;
          (in_RDI->m_GameInfo).m_aTeamSize[iVar3] = (in_RDI->m_GameInfo).m_aTeamSize[iVar3] + -1;
        }
        CClientData::Reset(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                           in_stack_fffffffffffffa9c);
        CStats::OnPlayerLeave((CStats *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
      }
      goto switchD_001cc6da_default;
    }
  }
  if (in_ESI == 0x21) {
    pIVar5 = Client(in_RDI);
    iVar3 = IClient::State(pIVar5);
    if (iVar3 != 4) {
      pIVar5 = Client(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
      if ((in_RDI->m_aClients[*piVar7].m_Active & 1U) == 0) {
        pCVar11 = Config(in_RDI);
        if (pCVar11->m_Debug != 0) {
          pIVar10 = Console(in_RDI);
          (*(pIVar10->super_IInterface)._vptr_IInterface[0x19])
                    (pIVar10,1,"client","invalid skin info",0);
        }
      }
      else {
        for (iVar3 = 0; iVar3 < 6; iVar3 = iVar3 + 1) {
          str_utf8_copy_num(in_stack_fffffffffffffad0,
                            (char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                            (int)((ulong)in_stack_fffffffffffffac0 >> 0x20),
                            (int)in_stack_fffffffffffffac0);
          in_RDI->m_aClients[*piVar7].m_aUseCustomColors[iVar3] = piVar7[(long)iVar3 + 0xe];
          in_RDI->m_aClients[*piVar7].m_aSkinPartColors[iVar3] = piVar7[(long)iVar3 + 0x14];
        }
        CClientData::UpdateRenderInfo
                  ((CClientData *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                   in_stack_fffffffffffffac0,(int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffab8 >> 0x18,0));
      }
      goto switchD_001cc6da_default;
    }
  }
  if (in_ESI == 0x13) {
    pIVar5 = Client(in_RDI);
    iVar3 = IClient::State(pIVar5);
    if (iVar3 != 4) {
      pIVar5 = Client(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
      (in_RDI->m_GameInfo).m_GameFlags = *piVar7;
      (in_RDI->m_GameInfo).m_ScoreLimit = piVar7[1];
      (in_RDI->m_GameInfo).m_TimeLimit = piVar7[2];
      (in_RDI->m_GameInfo).m_MatchNum = piVar7[3];
      (in_RDI->m_GameInfo).m_MatchCurrent = piVar7[4];
      goto switchD_001cc6da_default;
    }
  }
  if (in_ESI == 0x11) {
    pIVar5 = Client(in_RDI);
    iVar3 = IClient::State(pIVar5);
    if (iVar3 != 4) {
      pIVar5 = Client(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[9])(pIVar5,0);
      if ((((in_RDI->m_ServerSettings).m_TeamLock & 1U) == 0) && (piVar7[3] != 0)) {
        Localize((char *)in_stack_fffffffffffffab0,(char *)in_RDI->m_pChat);
        CChat::AddLine(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffb1c);
      }
      else if ((((in_RDI->m_ServerSettings).m_TeamLock & 1U) != 0) && (piVar7[3] == 0)) {
        Localize((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8->m_aName);
        CChat::AddLine(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                       (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffb1c);
      }
      (in_RDI->m_ServerSettings).m_KickVote = *piVar7 != 0;
      (in_RDI->m_ServerSettings).m_KickMin = piVar7[1];
      (in_RDI->m_ServerSettings).m_SpecVote = piVar7[2] != 0;
      (in_RDI->m_ServerSettings).m_TeamLock = piVar7[3] != 0;
      (in_RDI->m_ServerSettings).m_TeamBalance = piVar7[4] != 0;
      (in_RDI->m_ServerSettings).m_PlayerSlots = piVar7[5];
      goto switchD_001cc6da_default;
    }
  }
  if (in_ESI == 4) {
    pIVar5 = Client(in_RDI);
    iVar3 = IClient::State(pIVar5);
    if (iVar3 != 4) {
      if (in_RDI->m_aClients[*piVar7].m_Team != -1) {
        iVar3 = in_RDI->m_aClients[*piVar7].m_Team;
        (in_RDI->m_GameInfo).m_aTeamSize[iVar3] = (in_RDI->m_GameInfo).m_aTeamSize[iVar3] + -1;
      }
      in_RDI->m_aClients[*piVar7].m_Team = piVar7[1];
      if (in_RDI->m_aClients[*piVar7].m_Team != -1) {
        iVar3 = in_RDI->m_aClients[*piVar7].m_Team;
        (in_RDI->m_GameInfo).m_aTeamSize[iVar3] = (in_RDI->m_GameInfo).m_aTeamSize[iVar3] + 1;
      }
      CClientData::UpdateRenderInfo
                ((CClientData *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                 in_stack_fffffffffffffac0,(int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffab8 >> 0x18,0));
      if (*piVar7 == in_RDI->m_LocalClientID) {
        in_RDI->m_TeamCooldownTick = piVar7[3];
        pIVar5 = Client(in_RDI);
        fVar14 = IClient::LocalTime(pIVar5);
        in_RDI->m_TeamChangeTime = fVar14;
      }
    }
    if (piVar7[2] == 0) {
      DoTeamChangeMessage(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                          in_stack_fffffffffffffacc,in_stack_fffffffffffffac8);
    }
  }
  else if (in_ESI == 8) {
    pIVar5 = Client(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x11])();
  }
  else if (in_ESI == 10) {
    in_RDI->m_aClients[*piVar7].m_Emoticon = piVar7[1];
    pIVar5 = Client(in_RDI);
    iVar3 = IClient::GameTick(pIVar5);
    in_RDI->m_aClients[*piVar7].m_EmoticonStart = iVar3;
  }
  else {
    if (in_ESI == 0x16) {
      pIVar5 = Client(in_RDI);
      iVar3 = IClient::State(pIVar5);
      if (iVar3 == 4) {
        DoEnterMessage(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffacc
                       ,in_stack_fffffffffffffac8);
        CStats::OnPlayerEnter
                  ((CStats *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
                   in_stack_fffffffffffffa98);
        goto switchD_001cc6da_default;
      }
    }
    iVar3 = (int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
    if (in_ESI == 0x17) {
      pIVar5 = Client(in_RDI);
      iVar4 = IClient::State(pIVar5);
      if (iVar4 == 4) {
        DoLeaveMessage((CGameClient *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                       (char *)in_stack_fffffffffffffac0,iVar3,(char *)in_stack_fffffffffffffab0);
        CStats::OnPlayerLeave((CStats *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
      }
    }
  }
switchD_001cc6da_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::OnMessage(int MsgId, CUnpacker *pUnpacker)
{
	Client()->RecordGameMessage(true);

	// special messages
	if(MsgId == NETMSGTYPE_SV_TUNEPARAMS && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		// unpack the new tuning
		CTuningParams NewTuning;
		int *pParams = (int *)&NewTuning;
		for(unsigned i = 0; i < sizeof(CTuningParams)/sizeof(int); i++)
			pParams[i] = pUnpacker->GetInt();

		// check for unpacking errors
		if(pUnpacker->Error())
			return;

		m_ServerMode = SERVERMODE_PURE;

		// apply new tuning
		m_Tuning = NewTuning;
		return;
	}
	else if(MsgId == NETMSGTYPE_SV_VOTEOPTIONLISTADD)
	{
		int NumOptions = pUnpacker->GetInt();
		for(int i = 0; i < NumOptions; i++)
		{
			const char *pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC);
			if(pUnpacker->Error())
				return;

			m_pVoting->AddOption(pDescription);
		}
	}
	else if(MsgId == NETMSGTYPE_SV_GAMEMSG)
	{
		int GameMsgID = pUnpacker->GetInt();

		// check for valid gamemsgid
		if(GameMsgID < 0 || GameMsgID >= NUM_GAMEMSGS)
			return;

		int aParaI[3];
		int NumParaI = 0;

		// get paras
		switch(gs_GameMsgList[GameMsgID].m_ParaType)
		{
		case PARA_I: NumParaI = 1; break;
		case PARA_II: NumParaI = 2; break;
		case PARA_III: NumParaI = 3; break;
		}
		for(int i = 0; i < NumParaI; i++)
		{
			aParaI[i] = pUnpacker->GetInt();
		}

		// check for unpacking errors
		if(pUnpacker->Error())
			return;

		// handle special messages
		char aBuf[256];
		bool TeamPlay = m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS;
		if(gs_GameMsgList[GameMsgID].m_Action == DO_SPECIAL)
		{
			switch(GameMsgID)
			{
			case GAMEMSG_CTF_DROP:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_DROP);
				break;
			case GAMEMSG_CTF_RETURN:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_RETURN);
				break;
			case GAMEMSG_TEAM_ALL:
				{
					const char *pMsg = "";
					switch(GetStrTeam(aParaI[0], TeamPlay))
					{
					case STR_TEAM_GAME: pMsg = Localize("All players were moved to the game"); break;
					case STR_TEAM_RED: pMsg = Localize("All players were moved to the red team"); break;
					case STR_TEAM_BLUE: pMsg = Localize("All players were moved to the blue team"); break;
					case STR_TEAM_SPECTATORS: pMsg = Localize("All players were moved to the spectators"); break;
					}
					m_pBroadcast->DoClientBroadcast(pMsg);
				}
				break;
			case GAMEMSG_TEAM_BALANCE_VICTIM:
				{
					const char *pMsg = "";
					switch(GetStrTeam(aParaI[0], TeamPlay))
					{
					case STR_TEAM_RED: pMsg = Localize("You were moved to the red team due to team balancing"); break;
					case STR_TEAM_BLUE: pMsg = Localize("You were moved to the blue team due to team balancing"); break;
					}
					m_pBroadcast->DoClientBroadcast(pMsg);
				}
				break;
			case GAMEMSG_CTF_GRAB:
				if(m_LocalClientID != -1 && (m_aClients[m_LocalClientID].m_Team != aParaI[0] || (m_Snap.m_SpecInfo.m_Active &&
								((m_Snap.m_SpecInfo.m_SpectatorID != -1 && m_aClients[m_Snap.m_SpecInfo.m_SpectatorID].m_Team != aParaI[0]) ||
								(m_Snap.m_SpecInfo.m_SpecMode == SPEC_FLAGRED && aParaI[0] != TEAM_RED) ||
								(m_Snap.m_SpecInfo.m_SpecMode == SPEC_FLAGBLUE && aParaI[0] != TEAM_BLUE)))))
					m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_GRAB_PL);
				else
					m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_GRAB_EN);
				break;
			case GAMEMSG_GAME_PAUSED:
				{
					int ClientID = clamp(aParaI[0], 0, MAX_CLIENTS - 1);
					char aLabel[64];
					GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, m_aClients[ClientID].m_aName);
					str_format(aBuf, sizeof(aBuf), Localize("'%s' initiated a pause"), aLabel);
					m_pChat->AddLine(aBuf);
				}
				break;
			case GAMEMSG_CTF_CAPTURE:
				m_pSounds->Enqueue(CSounds::CHN_GLOBAL, SOUND_CTF_CAPTURE);
				int ClientID = clamp(aParaI[1], 0, MAX_CLIENTS - 1);
				m_pStats->OnFlagCapture(ClientID);
				char aLabel[64];
				GetPlayerLabel(aLabel, sizeof(aLabel), ClientID, m_aClients[ClientID].m_aName);

				float Time = aParaI[2] / (float)Client()->GameTickSpeed();
				if(Time <= 60)
				{
					if(aParaI[0])
					{
						str_format(aBuf, sizeof(aBuf), Localize("The blue flag was captured by '%s' (%.2f seconds)"), aLabel, Time);
					}
					else
					{
						str_format(aBuf, sizeof(aBuf), Localize("The red flag was captured by '%s' (%.2f seconds)"), aLabel, Time);
					}
				}
				else
				{
					if(aParaI[0])
					{
						str_format(aBuf, sizeof(aBuf), Localize("The blue flag was captured by '%s'"), aLabel);
					}
					else
					{
						str_format(aBuf, sizeof(aBuf), Localize("The red flag was captured by '%s'"), aLabel);
					}
				}
				m_pChat->AddLine(aBuf);
			}
			return;
		}

		// build message
		const char *pText = "";
		if(NumParaI == 0)
		{
			pText = Localize(gs_GameMsgList[GameMsgID].m_pText);
		}

		// handle message
		switch(gs_GameMsgList[GameMsgID].m_Action)
		{
		case DO_CHAT:
			m_pChat->AddLine(pText);
			break;
		case DO_BROADCAST:
			m_pBroadcast->DoClientBroadcast(pText);
			break;
		}
	}

	void *pRawMsg = m_NetObjHandler.SecureUnpackMsg(MsgId, pUnpacker);
	if(!pRawMsg)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "dropped weird message '%s' (%d), failed on '%s'", m_NetObjHandler.GetMsgName(MsgId), MsgId, m_NetObjHandler.FailedMsgOn());
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
		return;
	}

	// TODO: this should be done smarter
	for(int i = 0; i < m_All.m_Num; i++)
		m_All.m_paComponents[i]->OnMessage(MsgId, pRawMsg);

	if(MsgId == NETMSGTYPE_SV_CLIENTINFO && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ClientInfo *pMsg = (CNetMsg_Sv_ClientInfo *)pRawMsg;

		if(pMsg->m_Local)
		{
			if(m_LocalClientID != -1)
			{
				if(Config()->m_Debug)
					Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid local clientinfo");
				return;
			}
			m_LocalClientID = pMsg->m_ClientID;
			m_TeamChangeTime = Client()->LocalTime();
		}
		else
		{
			if(m_aClients[pMsg->m_ClientID].m_Active)
			{
				if(Config()->m_Debug)
					Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid clientinfo");
				return;
			}

			if(m_LocalClientID != -1 && !pMsg->m_Silent)
			{
				DoEnterMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_Team);

				if(m_pDemoRecorder->IsRecording())
				{
					CNetMsg_De_ClientEnter Msg;
					Msg.m_pName = pMsg->m_pName;
					Msg.m_ClientID = pMsg->m_ClientID;
					Msg.m_Team = pMsg->m_Team;
					Client()->SendPackMsg(&Msg, MSGFLAG_NOSEND|MSGFLAG_RECORD);
				}
			}
		}

		m_aClients[pMsg->m_ClientID].m_Active = true;
		m_aClients[pMsg->m_ClientID].m_Team  = pMsg->m_Team;
		str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_pName, sizeof(m_aClients[pMsg->m_ClientID].m_aName), MAX_NAME_LENGTH);
		str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aClan, pMsg->m_pClan, sizeof(m_aClients[pMsg->m_ClientID].m_aClan), MAX_CLAN_LENGTH);
		m_aClients[pMsg->m_ClientID].m_Country = pMsg->m_Country;
		for(int i = 0; i < NUM_SKINPARTS; i++)
		{
			str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i], pMsg->m_apSkinPartNames[i], sizeof(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i]), MAX_SKIN_LENGTH);
			m_aClients[pMsg->m_ClientID].m_aUseCustomColors[i] = pMsg->m_aUseCustomColors[i];
			m_aClients[pMsg->m_ClientID].m_aSkinPartColors[i] = pMsg->m_aSkinPartColors[i];
		}

		// update friend state
		m_aClients[pMsg->m_ClientID].m_Friend = Friends()->IsFriend(m_aClients[pMsg->m_ClientID].m_aName, m_aClients[pMsg->m_ClientID].m_aClan, true);
		// update chat ignore state
		m_aClients[pMsg->m_ClientID].m_ChatIgnore = Blacklist()->IsIgnored(m_aClients[pMsg->m_ClientID].m_aName, m_aClients[pMsg->m_ClientID].m_aClan, true);
		if(m_aClients[pMsg->m_ClientID].m_ChatIgnore)
		{
			char aBuf[128];
			char aLabel[64];
			GetPlayerLabel(aLabel, sizeof(aLabel), pMsg->m_ClientID, m_aClients[pMsg->m_ClientID].m_aName);
			str_format(aBuf, sizeof(aBuf), Localize("%s is muted by you"), aLabel);
			m_pChat->AddLine(aBuf, CChat::CLIENT_MSG);
		}

		m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, true);

		m_GameInfo.m_NumPlayers++;
		// calculate team-balance
		if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
			m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]++;

		m_pStats->OnPlayerEnter(pMsg->m_ClientID, pMsg->m_Team);
	}
	else if(MsgId == NETMSGTYPE_SV_CLIENTDROP && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ClientDrop *pMsg = (CNetMsg_Sv_ClientDrop *)pRawMsg;

		if(m_LocalClientID == pMsg->m_ClientID || !m_aClients[pMsg->m_ClientID].m_Active)
		{
			if(Config()->m_Debug)
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid clientdrop");
			return;
		}

		if(!pMsg->m_Silent)
		{
			DoLeaveMessage(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_ClientID, pMsg->m_pReason);

			CNetMsg_De_ClientLeave Msg;
			Msg.m_pName = m_aClients[pMsg->m_ClientID].m_aName;
			Msg.m_ClientID = pMsg->m_ClientID;
			Msg.m_pReason = pMsg->m_pReason;
			Client()->SendPackMsg(&Msg, MSGFLAG_NOSEND | MSGFLAG_RECORD);
		}

		m_GameInfo.m_NumPlayers--;
		// calculate team-balance
		if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
			m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]--;

		m_aClients[pMsg->m_ClientID].Reset(this, pMsg->m_ClientID);
		m_pStats->OnPlayerLeave(pMsg->m_ClientID);
	}
	else if(MsgId == NETMSGTYPE_SV_SKINCHANGE && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_SkinChange *pMsg = (CNetMsg_Sv_SkinChange *)pRawMsg;

		if(!m_aClients[pMsg->m_ClientID].m_Active)
		{
			if(Config()->m_Debug)
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "invalid skin info");
			return;
		}

		for(int i = 0; i < NUM_SKINPARTS; i++)
		{
			str_utf8_copy_num(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i], pMsg->m_apSkinPartNames[i], sizeof(m_aClients[pMsg->m_ClientID].m_aaSkinPartNames[i]), MAX_SKIN_LENGTH);
			m_aClients[pMsg->m_ClientID].m_aUseCustomColors[i] = pMsg->m_aUseCustomColors[i];
			m_aClients[pMsg->m_ClientID].m_aSkinPartColors[i] = pMsg->m_aSkinPartColors[i];
		}
		m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, true);
	}
	else if(MsgId == NETMSGTYPE_SV_GAMEINFO && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_GameInfo *pMsg = (CNetMsg_Sv_GameInfo *)pRawMsg;

		m_GameInfo.m_GameFlags = pMsg->m_GameFlags;
		m_GameInfo.m_ScoreLimit = pMsg->m_ScoreLimit;
		m_GameInfo.m_TimeLimit = pMsg->m_TimeLimit;
		m_GameInfo.m_MatchNum = pMsg->m_MatchNum;
		m_GameInfo.m_MatchCurrent = pMsg->m_MatchCurrent;
	}
	else if(MsgId == NETMSGTYPE_SV_SERVERSETTINGS && Client()->State() != IClient::STATE_DEMOPLAYBACK)
	{
		Client()->RecordGameMessage(false);
		CNetMsg_Sv_ServerSettings *pMsg = (CNetMsg_Sv_ServerSettings *)pRawMsg;

		if(!m_ServerSettings.m_TeamLock && pMsg->m_TeamLock)
			m_pChat->AddLine(Localize("Teams were locked"));
		else if(m_ServerSettings.m_TeamLock && !pMsg->m_TeamLock)
			m_pChat->AddLine(Localize("Teams were unlocked"));

		m_ServerSettings.m_KickVote = pMsg->m_KickVote;
		m_ServerSettings.m_KickMin = pMsg->m_KickMin;
		m_ServerSettings.m_SpecVote = pMsg->m_SpecVote;
		m_ServerSettings.m_TeamLock = pMsg->m_TeamLock;
		m_ServerSettings.m_TeamBalance = pMsg->m_TeamBalance;
		m_ServerSettings.m_PlayerSlots = pMsg->m_PlayerSlots;
	}
	else if(MsgId == NETMSGTYPE_SV_TEAM)
	{
		CNetMsg_Sv_Team *pMsg = (CNetMsg_Sv_Team *)pRawMsg;

		if(Client()->State() != IClient::STATE_DEMOPLAYBACK)
		{
			// calculate team-balance
			if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
				m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]--;
			m_aClients[pMsg->m_ClientID].m_Team = pMsg->m_Team;
			if(m_aClients[pMsg->m_ClientID].m_Team != TEAM_SPECTATORS)
				m_GameInfo.m_aTeamSize[m_aClients[pMsg->m_ClientID].m_Team]++;

			m_aClients[pMsg->m_ClientID].UpdateRenderInfo(this, pMsg->m_ClientID, false);

			if(pMsg->m_ClientID == m_LocalClientID)
			{
				m_TeamCooldownTick = pMsg->m_CooldownTick;
				m_TeamChangeTime = Client()->LocalTime();
			}
		}

		if(pMsg->m_Silent == 0)
		{
			DoTeamChangeMessage(m_aClients[pMsg->m_ClientID].m_aName, pMsg->m_ClientID, pMsg->m_Team);
		}
	}
	else if(MsgId == NETMSGTYPE_SV_READYTOENTER)
	{
		Client()->EnterGame();
	}
	else if (MsgId == NETMSGTYPE_SV_EMOTICON)
	{
		CNetMsg_Sv_Emoticon *pMsg = (CNetMsg_Sv_Emoticon *)pRawMsg;

		// apply
		m_aClients[pMsg->m_ClientID].m_Emoticon = pMsg->m_Emoticon;
		m_aClients[pMsg->m_ClientID].m_EmoticonStart = Client()->GameTick();
	}
	else if(MsgId == NETMSGTYPE_DE_CLIENTENTER && Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		CNetMsg_De_ClientEnter *pMsg = (CNetMsg_De_ClientEnter *)pRawMsg;
		DoEnterMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_Team);
		m_pStats->OnPlayerEnter(pMsg->m_ClientID, pMsg->m_Team);
	}
	else if(MsgId == NETMSGTYPE_DE_CLIENTLEAVE && Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		CNetMsg_De_ClientLeave *pMsg = (CNetMsg_De_ClientLeave *)pRawMsg;
		DoLeaveMessage(pMsg->m_pName, pMsg->m_ClientID, pMsg->m_pReason);
		m_pStats->OnPlayerLeave(pMsg->m_ClientID);
	}
}